

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O1

void __thiscall chrono::fea::ChContinuumElastic::ComputeStressStrainMatrix(ChContinuumElastic *this)

{
  ChMatrixDynamic<> *this_00;
  double dVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  ActualDstType actualDst;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  assign_op<double,_double> local_29;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_28;
  
  this_00 = &this->StressStrainMatrix;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)this_00,0x24,6,6);
  local_28.m_rows.m_value =
       (this->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
       m_storage.m_rows;
  local_28.m_cols.m_value =
       (this->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
       m_storage.m_cols;
  local_28.m_functor.m_other = 0.0;
  if ((local_28.m_cols.m_value | local_28.m_rows.m_value) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
            (this_00,&local_28,&local_29);
  lVar2 = (this->StressStrainMatrix).
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
  if ((0 < lVar2) &&
     (lVar3 = (this->StressStrainMatrix).
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols,
     0 < lVar3)) {
    dVar1 = this->v;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar1;
    auVar5 = ZEXT816(0x3ff0000000000000);
    auVar6 = vfmadd132sd_fma(auVar6,auVar5,ZEXT816(0xc000000000000000));
    pdVar4 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
             m_data;
    *pdVar4 = (((1.0 - dVar1) * this->E) / (dVar1 + 1.0)) / auVar6._0_8_;
    if ((lVar2 != 1) && (lVar3 != 1)) {
      dVar1 = this->v;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar1;
      auVar6 = vfmadd132sd_fma(auVar7,auVar5,ZEXT816(0xc000000000000000));
      pdVar4[lVar3 + 1] = (((1.0 - dVar1) * this->E) / (dVar1 + 1.0)) / auVar6._0_8_;
      if ((2 < lVar2) && (2 < lVar3)) {
        dVar1 = this->v;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = dVar1;
        auVar7 = ZEXT816(0xc000000000000000);
        auVar6 = vfmadd213sd_fma(auVar8,auVar7,auVar5);
        pdVar4[lVar3 * 2 + 2] = (((1.0 - dVar1) * this->E) / (dVar1 + 1.0)) / auVar6._0_8_;
        dVar1 = this->v;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = dVar1;
        auVar6 = vfmadd213sd_fma(auVar9,auVar7,auVar5);
        pdVar4[1] = ((dVar1 * this->E) / (dVar1 + 1.0)) / auVar6._0_8_;
        dVar1 = this->v;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = dVar1;
        auVar6 = vfmadd213sd_fma(auVar10,auVar7,auVar5);
        pdVar4[2] = ((dVar1 * this->E) / (dVar1 + 1.0)) / auVar6._0_8_;
        dVar1 = this->v;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar1;
        auVar6 = vfmadd213sd_fma(auVar11,auVar7,auVar5);
        pdVar4[lVar3] = ((dVar1 * this->E) / (dVar1 + 1.0)) / auVar6._0_8_;
        dVar1 = this->v;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = dVar1;
        auVar6 = vfmadd213sd_fma(auVar12,auVar7,auVar5);
        pdVar4[lVar3 + 2] = ((dVar1 * this->E) / (dVar1 + 1.0)) / auVar6._0_8_;
        dVar1 = this->v;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar1;
        auVar6 = vfmadd213sd_fma(auVar13,auVar7,auVar5);
        pdVar4[lVar3 * 2] = ((dVar1 * this->E) / (dVar1 + 1.0)) / auVar6._0_8_;
        dVar1 = this->v;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = dVar1;
        auVar6 = vfmadd213sd_fma(auVar7,auVar14,auVar5);
        pdVar4[lVar3 * 2 + 1] = ((dVar1 * this->E) / (dVar1 + 1.0)) / auVar6._0_8_;
        if ((3 < lVar2) && (3 < lVar3)) {
          auVar15._8_8_ = 0;
          auVar15._0_8_ = this->v;
          auVar6 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar15,auVar5);
          pdVar4[lVar3 * 3 + 3] =
               (((auVar6._0_8_ * this->E) / (this->v + 1.0)) / auVar6._0_8_) * 0.5;
          if ((4 < lVar2) && (4 < lVar3)) {
            auVar16._8_8_ = 0;
            auVar16._0_8_ = this->v;
            auVar6 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar16,auVar5);
            pdVar4[lVar3 * 4 + 4] =
                 (((auVar6._0_8_ * this->E) / (this->v + 1.0)) / auVar6._0_8_) * 0.5;
            if ((5 < lVar2) && (5 < lVar3)) {
              auVar17._8_8_ = 0;
              auVar17._0_8_ = this->v;
              auVar6 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar17,auVar5);
              pdVar4[lVar3 * 5 + 5] =
                   (((auVar6._0_8_ * this->E) / (this->v + 1.0)) / auVar6._0_8_) * 0.5;
              return;
            }
          }
        }
      }
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChContinuumElastic::ComputeStressStrainMatrix() {
    StressStrainMatrix.setZero(6, 6);
    StressStrainMatrix(0, 0) = (E * (1 - v)) / (1 + v) / (1 - 2 * v);
    // StressStrainMatrix(1,1)=StressStrainMatrix(0,0);	//
    // StressStrainMatrix(2,2)=StressStrainMatrix(0,0);	//per non ricalcolare; qual'� meglio?
    StressStrainMatrix(1, 1) = (E * (1 - v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(2, 2) = (E * (1 - v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(0, 1) = (E * (v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(0, 2) = (E * (v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(1, 0) = (E * (v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(1, 2) = (E * (v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(2, 0) = (E * (v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(2, 1) = (E * (v)) / (1 + v) / (1 - 2 * v);
    StressStrainMatrix(3, 3) = (E * (1 - 2 * v)) / (1 + v) / (1 - 2 * v) / 2;
    StressStrainMatrix(4, 4) = (E * (1 - 2 * v)) / (1 + v) / (1 - 2 * v) / 2;
    StressStrainMatrix(5, 5) = (E * (1 - 2 * v)) / (1 + v) / (1 - 2 * v) / 2;
}